

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinKrylovDemo_ls.c
# Opt level: O0

int PrecSolveBD(N_Vector cc,N_Vector cscale,N_Vector fval,N_Vector fscale,N_Vector vv,
               void *user_data)

{
  long *in_R8;
  long in_R9;
  UserData data;
  sunindextype jy;
  sunindextype jx;
  sunindextype *piv;
  sunrealtype *vxy;
  sunrealtype **Pxy;
  undefined8 local_58;
  undefined8 local_50;
  
  for (local_50 = 0; local_50 < 5; local_50 = local_50 + 1) {
    for (local_58 = 0; local_58 < 5; local_58 = local_58 + 1) {
      SUNDlsMat_denseGETRS
                (*(undefined8 *)(in_R9 + local_50 * 0x28 + local_58 * 8),6,
                 *(undefined8 *)(in_R9 + 200 + local_50 * 0x28 + local_58 * 8),
                 *(long *)(*in_R8 + 0x10) + (local_50 * 6 + local_58 * 0x1e) * 8);
    }
  }
  return 0;
}

Assistant:

static int PrecSolveBD(N_Vector cc, N_Vector cscale, N_Vector fval,
                       N_Vector fscale, N_Vector vv, void* user_data)
{
  sunrealtype **Pxy, *vxy;
  sunindextype *piv, jx, jy;
  UserData data;

  data = (UserData)user_data;

  for (jx = 0; jx < MX; jx++)
  {
    for (jy = 0; jy < MY; jy++)
    {
      /* For each (jx,jy), solve a linear system of size NUM_SPECIES.
         vxy is the address of the corresponding portion of the vector vv;
         Pxy is the address of the corresponding block of the matrix P;
         piv is the address of the corresponding block of the array pivot. */
      vxy = IJ_Vptr(vv, jx, jy);
      Pxy = (data->P)[jx][jy];
      piv = (data->pivot)[jx][jy];
      SUNDlsMat_denseGETRS(Pxy, NUM_SPECIES, piv, vxy);

    } /* end of jy loop */

  } /* end of jx loop */

  return (0);
}